

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteGeometry(ColladaExporter *this,size_t pIndex)

{
  bool bVar1;
  char *__s;
  ostream *poVar2;
  uint *puVar3;
  ulong local_218;
  size_t b_1;
  aiFace *face_1;
  size_t a_9;
  size_t a_8;
  size_t a_7;
  size_t a_6;
  size_t b;
  aiFace *face;
  size_t a_5;
  size_t a_4;
  size_t a_3;
  size_t a_2;
  int countPoly;
  int countLines;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  ulong local_150;
  size_t a_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ulong local_e8;
  size_t a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined4 local_9c;
  undefined1 local_98 [8];
  string geometryId;
  string geometryName;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string idstr;
  aiMesh *mesh;
  size_t pIndex_local;
  ColladaExporter *this_local;
  
  idstr.field_2._8_8_ = this->mScene->mMeshes[pIndex];
  if ((((aiMesh *)idstr.field_2._8_8_)->mName).length == 0) {
    GetMeshId_abi_cxx11_((string *)local_40,this,pIndex);
  }
  else {
    __s = aiString::C_Str(&((aiMesh *)idstr.field_2._8_8_)->mName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,__s,&local_41);
    std::allocator<char>::~allocator(&local_41);
  }
  XMLEscape((string *)((long)&geometryId.field_2 + 8),(string *)local_40);
  XMLIDEncode((string *)local_98,(string *)local_40);
  if ((*(int *)(idstr.field_2._8_8_ + 8) == 0) || (*(int *)(idstr.field_2._8_8_ + 4) == 0)) {
    local_9c = 1;
  }
  else {
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"<geometry id=\"");
    poVar2 = std::operator<<(poVar2,(string *)local_98);
    poVar2 = std::operator<<(poVar2,"\" name=\"");
    poVar2 = std::operator<<(poVar2,(string *)(geometryId.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2,"\" >");
    std::operator<<(poVar2,(string *)&this->endstr);
    PushTag(this);
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"<mesh>");
    std::operator<<(poVar2,(string *)&this->endstr);
    PushTag(this);
    std::operator+(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "-positions");
    WriteFloatArray(this,&local_c0,FloatType_Vector,*(ai_real **)(idstr.field_2._8_8_ + 0x10),
                    (ulong)*(uint *)(idstr.field_2._8_8_ + 4));
    std::__cxx11::string::~string((string *)&local_c0);
    bVar1 = aiMesh::HasNormals((aiMesh *)idstr.field_2._8_8_);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     "-normals");
      WriteFloatArray(this,(string *)&a,FloatType_Vector,*(ai_real **)(idstr.field_2._8_8_ + 0x18),
                      (ulong)*(uint *)(idstr.field_2._8_8_ + 4));
      std::__cxx11::string::~string((string *)&a);
    }
    for (local_e8 = 0; local_e8 < 8; local_e8 = local_e8 + 1) {
      bVar1 = aiMesh::HasTextureCoords((aiMesh *)idstr.field_2._8_8_,(uint)local_e8);
      if (bVar1) {
        std::operator+(&local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                       ,"-tex");
        to_string<unsigned_long>((string *)&a_1,local_e8);
        std::operator+(&local_108,&local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a_1);
        WriteFloatArray(this,&local_108,
                        (*(int *)(idstr.field_2._8_8_ + 0xb0 + local_e8 * 4) == 3) +
                        FloatType_TexCoord2,*(ai_real **)(idstr.field_2._8_8_ + 0x70 + local_e8 * 8)
                        ,(ulong)*(uint *)(idstr.field_2._8_8_ + 4));
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&a_1);
        std::__cxx11::string::~string((string *)&local_128);
      }
    }
    for (local_150 = 0; local_150 < 8; local_150 = local_150 + 1) {
      bVar1 = aiMesh::HasVertexColors((aiMesh *)idstr.field_2._8_8_,(uint)local_150);
      if (bVar1) {
        std::operator+(&local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                       ,"-color");
        to_string<unsigned_long>((string *)&countPoly,local_150);
        std::operator+(&local_170,&local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &countPoly);
        WriteFloatArray(this,&local_170,FloatType_Color,
                        *(ai_real **)(idstr.field_2._8_8_ + 0x30 + local_150 * 8),
                        (ulong)*(uint *)(idstr.field_2._8_8_ + 4));
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&countPoly);
        std::__cxx11::string::~string((string *)&local_190);
      }
    }
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"<vertices id=\"");
    poVar2 = std::operator<<(poVar2,(string *)local_98);
    poVar2 = std::operator<<(poVar2,"-vertices");
    poVar2 = std::operator<<(poVar2,"\">");
    std::operator<<(poVar2,(string *)&this->endstr);
    PushTag(this);
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"<input semantic=\"POSITION\" source=\"#");
    poVar2 = std::operator<<(poVar2,(string *)local_98);
    poVar2 = std::operator<<(poVar2,"-positions\" />");
    std::operator<<(poVar2,(string *)&this->endstr);
    PopTag(this);
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"</vertices>");
    std::operator<<(poVar2,(string *)&this->endstr);
    a_2._4_4_ = 0;
    a_2._0_4_ = 0;
    for (a_3 = 0; a_3 < *(uint *)(idstr.field_2._8_8_ + 8); a_3 = a_3 + 1) {
      if (*(int *)(*(long *)(idstr.field_2._8_8_ + 0xd0) + a_3 * 0x10) == 2) {
        a_2._4_4_ = a_2._4_4_ + 1;
      }
      else if (2 < *(uint *)(*(long *)(idstr.field_2._8_8_ + 0xd0) + a_3 * 0x10)) {
        a_2._0_4_ = (int)a_2 + 1;
      }
    }
    if (a_2._4_4_ != 0) {
      poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar2 = std::operator<<(poVar2,"<lines count=\"");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,a_2._4_4_);
      poVar2 = std::operator<<(poVar2,"\" material=\"defaultMaterial\">");
      std::operator<<(poVar2,(string *)&this->endstr);
      PushTag(this);
      poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar2 = std::operator<<(poVar2,"<input offset=\"0\" semantic=\"VERTEX\" source=\"#");
      poVar2 = std::operator<<(poVar2,(string *)local_98);
      poVar2 = std::operator<<(poVar2,"-vertices\" />");
      std::operator<<(poVar2,(string *)&this->endstr);
      bVar1 = aiMesh::HasNormals((aiMesh *)idstr.field_2._8_8_);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar2 = std::operator<<(poVar2,"<input semantic=\"NORMAL\" source=\"#");
        poVar2 = std::operator<<(poVar2,(string *)local_98);
        poVar2 = std::operator<<(poVar2,"-normals\" />");
        std::operator<<(poVar2,(string *)&this->endstr);
      }
      for (a_4 = 0; a_4 < 8; a_4 = a_4 + 1) {
        bVar1 = aiMesh::HasTextureCoords((aiMesh *)idstr.field_2._8_8_,(uint)a_4);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
          poVar2 = std::operator<<(poVar2,"<input semantic=\"TEXCOORD\" source=\"#");
          poVar2 = std::operator<<(poVar2,(string *)local_98);
          poVar2 = std::operator<<(poVar2,"-tex");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,a_4);
          poVar2 = std::operator<<(poVar2,"\" ");
          poVar2 = std::operator<<(poVar2,"set=\"");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,a_4);
          poVar2 = std::operator<<(poVar2,"\"");
          poVar2 = std::operator<<(poVar2," />");
          std::operator<<(poVar2,(string *)&this->endstr);
        }
      }
      for (a_5 = 0; a_5 < 8; a_5 = a_5 + 1) {
        bVar1 = aiMesh::HasVertexColors((aiMesh *)idstr.field_2._8_8_,(uint)a_5);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
          poVar2 = std::operator<<(poVar2,"<input semantic=\"COLOR\" source=\"#");
          poVar2 = std::operator<<(poVar2,(string *)local_98);
          poVar2 = std::operator<<(poVar2,"-color");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,a_5);
          poVar2 = std::operator<<(poVar2,"\" ");
          poVar2 = std::operator<<(poVar2,"set=\"");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,a_5);
          poVar2 = std::operator<<(poVar2,"\"");
          poVar2 = std::operator<<(poVar2," />");
          std::operator<<(poVar2,(string *)&this->endstr);
        }
      }
      poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      std::operator<<(poVar2,"<p>");
      for (face = (aiFace *)0x0; face < (aiFace *)(ulong)*(uint *)(idstr.field_2._8_8_ + 8);
          face = (aiFace *)((long)&face->mNumIndices + 1)) {
        puVar3 = (uint *)(*(long *)(idstr.field_2._8_8_ + 0xd0) + (long)face * 0x10);
        if (*puVar3 == 2) {
          for (a_6 = 0; a_6 < *puVar3; a_6 = a_6 + 1) {
            poVar2 = (ostream *)
                     std::ostream::operator<<
                               (&this->field_0x38,*(uint *)(*(long *)(puVar3 + 2) + a_6 * 4));
            std::operator<<(poVar2," ");
          }
        }
      }
      poVar2 = std::operator<<((ostream *)&this->field_0x38,"</p>");
      std::operator<<(poVar2,(string *)&this->endstr);
      PopTag(this);
      poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar2 = std::operator<<(poVar2,"</lines>");
      std::operator<<(poVar2,(string *)&this->endstr);
    }
    if ((int)a_2 != 0) {
      poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar2 = std::operator<<(poVar2,"<polylist count=\"");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)a_2);
      poVar2 = std::operator<<(poVar2,"\" material=\"defaultMaterial\">");
      std::operator<<(poVar2,(string *)&this->endstr);
      PushTag(this);
      poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar2 = std::operator<<(poVar2,"<input offset=\"0\" semantic=\"VERTEX\" source=\"#");
      poVar2 = std::operator<<(poVar2,(string *)local_98);
      poVar2 = std::operator<<(poVar2,"-vertices\" />");
      std::operator<<(poVar2,(string *)&this->endstr);
      bVar1 = aiMesh::HasNormals((aiMesh *)idstr.field_2._8_8_);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
        poVar2 = std::operator<<(poVar2,"<input offset=\"0\" semantic=\"NORMAL\" source=\"#");
        poVar2 = std::operator<<(poVar2,(string *)local_98);
        poVar2 = std::operator<<(poVar2,"-normals\" />");
        std::operator<<(poVar2,(string *)&this->endstr);
      }
      for (a_7 = 0; a_7 < 8; a_7 = a_7 + 1) {
        bVar1 = aiMesh::HasTextureCoords((aiMesh *)idstr.field_2._8_8_,(uint)a_7);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
          poVar2 = std::operator<<(poVar2,"<input offset=\"0\" semantic=\"TEXCOORD\" source=\"#");
          poVar2 = std::operator<<(poVar2,(string *)local_98);
          poVar2 = std::operator<<(poVar2,"-tex");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,a_7);
          poVar2 = std::operator<<(poVar2,"\" ");
          poVar2 = std::operator<<(poVar2,"set=\"");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,a_7);
          poVar2 = std::operator<<(poVar2,"\"");
          poVar2 = std::operator<<(poVar2," />");
          std::operator<<(poVar2,(string *)&this->endstr);
        }
      }
      for (a_8 = 0; a_8 < 8; a_8 = a_8 + 1) {
        bVar1 = aiMesh::HasVertexColors((aiMesh *)idstr.field_2._8_8_,(uint)a_8);
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
          poVar2 = std::operator<<(poVar2,"<input offset=\"0\" semantic=\"COLOR\" source=\"#");
          poVar2 = std::operator<<(poVar2,(string *)local_98);
          poVar2 = std::operator<<(poVar2,"-color");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,a_8);
          poVar2 = std::operator<<(poVar2,"\" ");
          poVar2 = std::operator<<(poVar2,"set=\"");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,a_8);
          poVar2 = std::operator<<(poVar2,"\"");
          poVar2 = std::operator<<(poVar2," />");
          std::operator<<(poVar2,(string *)&this->endstr);
        }
      }
      poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      std::operator<<(poVar2,"<vcount>");
      for (a_9 = 0; a_9 < *(uint *)(idstr.field_2._8_8_ + 8); a_9 = a_9 + 1) {
        if (2 < *(uint *)(*(long *)(idstr.field_2._8_8_ + 0xd0) + a_9 * 0x10)) {
          poVar2 = (ostream *)
                   std::ostream::operator<<
                             (&this->field_0x38,
                              *(uint *)(*(long *)(idstr.field_2._8_8_ + 0xd0) + a_9 * 0x10));
          std::operator<<(poVar2," ");
        }
      }
      poVar2 = std::operator<<((ostream *)&this->field_0x38,"</vcount>");
      std::operator<<(poVar2,(string *)&this->endstr);
      poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      std::operator<<(poVar2,"<p>");
      for (face_1 = (aiFace *)0x0; face_1 < (aiFace *)(ulong)*(uint *)(idstr.field_2._8_8_ + 8);
          face_1 = (aiFace *)((long)&face_1->mNumIndices + 1)) {
        puVar3 = (uint *)(*(long *)(idstr.field_2._8_8_ + 0xd0) + (long)face_1 * 0x10);
        if (2 < *puVar3) {
          for (local_218 = 0; local_218 < *puVar3; local_218 = local_218 + 1) {
            poVar2 = (ostream *)
                     std::ostream::operator<<
                               (&this->field_0x38,*(uint *)(*(long *)(puVar3 + 2) + local_218 * 4));
            std::operator<<(poVar2," ");
          }
        }
      }
      poVar2 = std::operator<<((ostream *)&this->field_0x38,"</p>");
      std::operator<<(poVar2,(string *)&this->endstr);
      PopTag(this);
      poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar2 = std::operator<<(poVar2,"</polylist>");
      std::operator<<(poVar2,(string *)&this->endstr);
    }
    PopTag(this);
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"</mesh>");
    std::operator<<(poVar2,(string *)&this->endstr);
    PopTag(this);
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"</geometry>");
    std::operator<<(poVar2,(string *)&this->endstr);
    local_9c = 0;
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(geometryId.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void ColladaExporter::WriteGeometry( size_t pIndex)
{
    const aiMesh* mesh = mScene->mMeshes[pIndex];
    const std::string idstr = mesh->mName.length == 0 ? GetMeshId(pIndex) : mesh->mName.C_Str();
    const std::string geometryName = XMLEscape(idstr);
    const std::string geometryId = XMLIDEncode(idstr);

    if ( mesh->mNumFaces == 0 || mesh->mNumVertices == 0 )
        return;

    // opening tag
    mOutput << startstr << "<geometry id=\"" << geometryId << "\" name=\"" << geometryName << "\" >" << endstr;
    PushTag();

    mOutput << startstr << "<mesh>" << endstr;
    PushTag();

    // Positions
    WriteFloatArray( idstr + "-positions", FloatType_Vector, (ai_real*) mesh->mVertices, mesh->mNumVertices);
    // Normals, if any
    if( mesh->HasNormals() )
        WriteFloatArray( idstr + "-normals", FloatType_Vector, (ai_real*) mesh->mNormals, mesh->mNumVertices);

    // texture coords
    for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a)
    {
        if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
        {
            WriteFloatArray( idstr + "-tex" + to_string(a), mesh->mNumUVComponents[a] == 3 ? FloatType_TexCoord3 : FloatType_TexCoord2,
                (ai_real*) mesh->mTextureCoords[a], mesh->mNumVertices);
        }
    }

    // vertex colors
    for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a)
    {
        if( mesh->HasVertexColors(static_cast<unsigned int>(a)) )
            WriteFloatArray( idstr + "-color" + to_string(a), FloatType_Color, (ai_real*) mesh->mColors[a], mesh->mNumVertices);
    }

    // assemble vertex structure
    // Only write input for POSITION since we will write other as shared inputs in polygon definition
    mOutput << startstr << "<vertices id=\"" << geometryId << "-vertices" << "\">" << endstr;
    PushTag();
    mOutput << startstr << "<input semantic=\"POSITION\" source=\"#" << geometryId << "-positions\" />" << endstr;
    PopTag();
    mOutput << startstr << "</vertices>" << endstr;

    // count the number of lines, triangles and polygon meshes
    int countLines = 0;
    int countPoly = 0;
    for( size_t a = 0; a < mesh->mNumFaces; ++a )
    {
        if (mesh->mFaces[a].mNumIndices == 2) countLines++;
        else if (mesh->mFaces[a].mNumIndices >= 3) countPoly++;
    }

    // lines
    if (countLines)
    {
        mOutput << startstr << "<lines count=\"" << countLines << "\" material=\"defaultMaterial\">" << endstr;
        PushTag();
        mOutput << startstr << "<input offset=\"0\" semantic=\"VERTEX\" source=\"#" << geometryId << "-vertices\" />" << endstr;
        if( mesh->HasNormals() )
            mOutput << startstr << "<input semantic=\"NORMAL\" source=\"#" << geometryId << "-normals\" />" << endstr;
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
                mOutput << startstr << "<input semantic=\"TEXCOORD\" source=\"#" << geometryId << "-tex" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( mesh->HasVertexColors(static_cast<unsigned int>(a) ) )
                mOutput << startstr << "<input semantic=\"COLOR\" source=\"#" << geometryId << "-color" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }

        mOutput << startstr << "<p>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            const aiFace& face = mesh->mFaces[a];
            if (face.mNumIndices != 2) continue;
            for( size_t b = 0; b < face.mNumIndices; ++b )
                mOutput << face.mIndices[b] << " ";
        }
        mOutput << "</p>" << endstr;
        PopTag();
        mOutput << startstr << "</lines>" << endstr;
    }

    // triangle - don't use it, because compatibility problems

    // polygons
    if (countPoly)
    {
        mOutput << startstr << "<polylist count=\"" << countPoly << "\" material=\"defaultMaterial\">" << endstr;
        PushTag();
        mOutput << startstr << "<input offset=\"0\" semantic=\"VERTEX\" source=\"#" << geometryId << "-vertices\" />" << endstr;
        if( mesh->HasNormals() )
            mOutput << startstr << "<input offset=\"0\" semantic=\"NORMAL\" source=\"#" << geometryId << "-normals\" />" << endstr;
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
                mOutput << startstr << "<input offset=\"0\" semantic=\"TEXCOORD\" source=\"#" << geometryId << "-tex" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( mesh->HasVertexColors(static_cast<unsigned int>(a) ) )
                mOutput << startstr << "<input offset=\"0\" semantic=\"COLOR\" source=\"#" << geometryId << "-color" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }

        mOutput << startstr << "<vcount>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            if (mesh->mFaces[a].mNumIndices < 3) continue;
            mOutput << mesh->mFaces[a].mNumIndices << " ";
        }
        mOutput << "</vcount>" << endstr;

        mOutput << startstr << "<p>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            const aiFace& face = mesh->mFaces[a];
            if (face.mNumIndices < 3) continue;
            for( size_t b = 0; b < face.mNumIndices; ++b )
                mOutput << face.mIndices[b] << " ";
        }
        mOutput << "</p>" << endstr;
        PopTag();
        mOutput << startstr << "</polylist>" << endstr;
    }

    // closing tags
    PopTag();
    mOutput << startstr << "</mesh>" << endstr;
    PopTag();
    mOutput << startstr << "</geometry>" << endstr;
}